

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

AtanhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_atanh(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  AtanhLayerParams *pAVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_atanh(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_atanh(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pAVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::AtanhLayerParams>(arena);
    (this->layer_).atanh_ = pAVar2;
  }
  return (AtanhLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AtanhLayerParams* NeuralNetworkLayer::_internal_mutable_atanh() {
  if (!_internal_has_atanh()) {
    clear_layer();
    set_has_atanh();
    layer_.atanh_ = CreateMaybeMessage< ::CoreML::Specification::AtanhLayerParams >(GetArenaForAllocation());
  }
  return layer_.atanh_;
}